

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::UnicodeSet::addAll(UnicodeSet *this,UnicodeSet *c)

{
  UBool UVar1;
  int32_t iVar2;
  UnicodeString *s_00;
  UnicodeString *s;
  int32_t i;
  UnicodeSet *c_local;
  UnicodeSet *this_local;
  
  if ((0 < c->len) && (c->list != (UChar32 *)0x0)) {
    add(this,c->list,c->len,'\0');
  }
  if (c->strings != (UVector *)0x0) {
    for (s._4_4_ = 0; iVar2 = UVector::size(c->strings), s._4_4_ < iVar2; s._4_4_ = s._4_4_ + 1) {
      s_00 = (UnicodeString *)UVector::elementAt(c->strings,s._4_4_);
      UVar1 = UVector::contains(this->strings,s_00);
      if (UVar1 == '\0') {
        _add(this,s_00);
      }
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::addAll(const UnicodeSet& c) {
    if ( c.len>0 && c.list!=NULL ) {
        add(c.list, c.len, 0);
    }

    // Add strings in order
    if ( c.strings!=NULL ) {
        for (int32_t i=0; i<c.strings->size(); ++i) {
            const UnicodeString* s = (const UnicodeString*)c.strings->elementAt(i);
            if (!strings->contains((void*) s)) {
                _add(*s);
            }
        }
    }
    return *this;
}